

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::DisallowedType(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                 *this,Context *context,ValueType *actualType)

{
  ErrorHandlerType *pEVar1;
  ValueType *pVVar2;
  ErrorHandler *eh;
  ValueType *actualType_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  pEVar1 = context->error_handler;
  (*pEVar1->_vptr_IValidationErrorHandler[0x20])();
  if ((this->type_ & 1) != 0) {
    pVVar2 = GetNullString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
  }
  if ((this->type_ & 2) != 0) {
    pVVar2 = GetBooleanString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
  }
  if ((this->type_ & 4) != 0) {
    pVVar2 = GetObjectString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
  }
  if ((this->type_ & 8) != 0) {
    pVVar2 = GetArrayString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
  }
  if ((this->type_ & 0x10) != 0) {
    pVVar2 = GetStringString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
  }
  if ((this->type_ & 0x20) == 0) {
    if ((this->type_ & 0x40) != 0) {
      pVVar2 = GetIntegerString();
      (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
    }
  }
  else {
    pVVar2 = GetNumberString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar2);
  }
  (*pEVar1->_vptr_IValidationErrorHandler[0x22])(pEVar1,actualType);
  return;
}

Assistant:

void DisallowedType(Context& context, const ValueType& actualType) const {
        ErrorHandler& eh = context.error_handler;
        eh.StartDisallowedType();

        if (type_ & (1 << kNullSchemaType)) eh.AddExpectedType(GetNullString());
        if (type_ & (1 << kBooleanSchemaType)) eh.AddExpectedType(GetBooleanString());
        if (type_ & (1 << kObjectSchemaType)) eh.AddExpectedType(GetObjectString());
        if (type_ & (1 << kArraySchemaType)) eh.AddExpectedType(GetArrayString());
        if (type_ & (1 << kStringSchemaType)) eh.AddExpectedType(GetStringString());

        if (type_ & (1 << kNumberSchemaType)) eh.AddExpectedType(GetNumberString());
        else if (type_ & (1 << kIntegerSchemaType)) eh.AddExpectedType(GetIntegerString());

        eh.EndDisallowedType(actualType);
    }